

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

OPJ_OFF_T opj_stream_read_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  OPJ_UINT64 OVar1;
  bool bVar2;
  OPJ_BOOL OVar3;
  OPJ_OFF_T OVar4;
  uint uVar5;
  OPJ_OFF_T OVar6;
  long lVar7;
  ulong uVar8;
  OPJ_UINT64 OVar9;
  
  if (p_size < 0) {
    __assert_fail("p_size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/cio.c"
                  ,0x1d5,
                  "OPJ_OFF_T opj_stream_read_skip(opj_stream_private_t *, OPJ_OFF_T, opj_event_mgr_t *)"
                 );
  }
  uVar8 = p_stream->m_bytes_in_buffer;
  if ((ulong)p_size <= uVar8) {
    p_stream->m_current_data = p_stream->m_current_data + p_size;
    p_stream->m_bytes_in_buffer = uVar8 - p_size;
    p_stream->m_byte_offset = p_stream->m_byte_offset + p_size;
    return p_size;
  }
  if ((p_stream->m_status & 4) != 0) {
    p_stream->m_current_data = p_stream->m_current_data + uVar8;
    p_stream->m_bytes_in_buffer = 0;
    p_stream->m_byte_offset = p_stream->m_byte_offset + uVar8;
LAB_00108cb1:
    return -(ulong)(uVar8 == 0) | uVar8;
  }
  OVar6 = p_size;
  if (uVar8 != 0) {
    p_stream->m_current_data = p_stream->m_stored_data;
    p_stream->m_bytes_in_buffer = 0;
    OVar6 = p_size - uVar8;
    if (p_size - uVar8 == 0 || p_size < (long)uVar8) goto LAB_00108bf4;
  }
  do {
    if (p_stream->m_user_data_length < uVar8 + OVar6 + p_stream->m_byte_offset) {
      opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
      OVar9 = uVar8 + p_stream->m_byte_offset;
      p_stream->m_byte_offset = OVar9;
      OVar1 = p_stream->m_user_data_length;
      p_stream->m_current_data = p_stream->m_stored_data;
      p_stream->m_bytes_in_buffer = 0;
      OVar3 = (*p_stream->m_seek_fn)(OVar1,p_stream->m_user_data);
      uVar5 = p_stream->m_status;
      if (OVar3 != 0) {
        uVar5 = uVar5 & 0xfffffffb;
        p_stream->m_byte_offset = OVar1;
      }
      p_stream->m_status = uVar5 | 4;
      if (OVar1 != OVar9) {
        return OVar1 - OVar9;
      }
      return -1;
    }
    OVar4 = (*p_stream->m_skip_fn)(OVar6,p_stream->m_user_data);
    if (OVar4 == -1) {
      opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
      *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 4;
      p_stream->m_byte_offset = p_stream->m_byte_offset + uVar8;
      goto LAB_00108cb1;
    }
    uVar8 = uVar8 + OVar4;
    lVar7 = OVar6 - OVar4;
    bVar2 = OVar4 <= OVar6;
    OVar6 = lVar7;
  } while (lVar7 != 0 && bVar2);
LAB_00108bf4:
  p_stream->m_byte_offset = p_stream->m_byte_offset + uVar8;
  return uVar8;
}

Assistant:

OPJ_OFF_T opj_stream_read_skip(opj_stream_private_t * p_stream,
                               OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
    OPJ_OFF_T l_skip_nb_bytes = 0;
    OPJ_OFF_T l_current_skip_nb_bytes = 0;

    assert(p_size >= 0);

    if (p_stream->m_bytes_in_buffer >= (OPJ_SIZE_T)p_size) {
        p_stream->m_current_data += p_size;
        /* it is safe to cast p_size to OPJ_SIZE_T since it is <= m_bytes_in_buffer
        which is of type OPJ_SIZE_T */
        p_stream->m_bytes_in_buffer -= (OPJ_SIZE_T)p_size;
        l_skip_nb_bytes += p_size;
        p_stream->m_byte_offset += l_skip_nb_bytes;
        return l_skip_nb_bytes;
    }

    /* we are now in the case when the remaining data if not sufficient */
    if (p_stream->m_status & OPJ_STREAM_STATUS_END) {
        l_skip_nb_bytes += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_current_data += p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
        p_stream->m_byte_offset += l_skip_nb_bytes;
        return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
    }

    /* the flag is not set, we copy data and then do an actual skip on the stream */
    if (p_stream->m_bytes_in_buffer) {
        l_skip_nb_bytes += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_current_data = p_stream->m_stored_data;
        p_size -= (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
    }

    while (p_size > 0) {
        /* Check if we are going beyond the end of file. Most skip_fn do not */
        /* check that, but we must be careful not to advance m_byte_offset */
        /* beyond m_user_data_length, otherwise */
        /* opj_stream_get_number_byte_left() will assert. */
        if ((OPJ_UINT64)(p_stream->m_byte_offset + l_skip_nb_bytes + p_size) >
                p_stream->m_user_data_length) {
            opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

            p_stream->m_byte_offset += l_skip_nb_bytes;
            l_skip_nb_bytes = (OPJ_OFF_T)(p_stream->m_user_data_length -
                                          (OPJ_UINT64)p_stream->m_byte_offset);

            opj_stream_read_seek(p_stream, (OPJ_OFF_T)p_stream->m_user_data_length,
                                 p_event_mgr);
            p_stream->m_status |= OPJ_STREAM_STATUS_END;

            /* end if stream */
            return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
        }

        /* we should do an actual skip on the media */
        l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);
        if (l_current_skip_nb_bytes == (OPJ_OFF_T) - 1) {
            opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

            p_stream->m_status |= OPJ_STREAM_STATUS_END;
            p_stream->m_byte_offset += l_skip_nb_bytes;
            /* end if stream */
            return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
        }
        p_size -= l_current_skip_nb_bytes;
        l_skip_nb_bytes += l_current_skip_nb_bytes;
    }

    p_stream->m_byte_offset += l_skip_nb_bytes;

    return l_skip_nb_bytes;
}